

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int verify_sign(void *verify_ctx,uint16_t algo,ptls_iovec_t data,ptls_iovec_t signature)

{
  int iVar1;
  EVP_MD *type;
  EVP_MD *pEVar2;
  undefined8 in_RCX;
  long in_RDX;
  uint16_t in_SI;
  EVP_PKEY *in_RDI;
  uchar *in_R8;
  size_t in_R9;
  int ret;
  EVP_PKEY_CTX *pkey_ctx;
  EVP_MD_CTX *ctx;
  st_ptls_openssl_signature_scheme_t *scheme;
  EVP_PKEY *key;
  int local_54;
  EVP_PKEY_CTX *pEVar3;
  EVP_MD_CTX *local_48;
  st_ptls_openssl_signature_scheme_t *local_40;
  
  local_48 = (EVP_MD_CTX *)0x0;
  pEVar3 = (EVP_PKEY_CTX *)0x0;
  local_54 = 0;
  if (in_RDX != 0) {
    local_40 = lookup_signature_schemes((EVP_PKEY *)0x0);
    if (local_40 == (st_ptls_openssl_signature_scheme_t *)0x0) {
      local_54 = 0x203;
    }
    else {
      for (; local_40->scheme_id != 0xffff; local_40 = local_40 + 1) {
        if (local_40->scheme_id == in_SI) {
          local_48 = (EVP_MD_CTX *)EVP_MD_CTX_new();
          if (local_48 == (EVP_MD_CTX *)0x0) {
            local_54 = 0x201;
            goto LAB_00108696;
          }
          iVar1 = EVP_PKEY_get_id(in_RDI);
          if (iVar1 == 0x43f) {
            iVar1 = EVP_DigestVerifyInit
                              (local_48,(EVP_PKEY_CTX **)&stack0xffffffffffffffb0,(EVP_MD *)0x0,
                               (ENGINE *)0x0,in_RDI);
            if (iVar1 != 1) {
              local_54 = 0x203;
              goto LAB_00108696;
            }
            iVar1 = EVP_DigestVerify(local_48,in_R8,in_R9,in_RDX,in_RCX);
            if (iVar1 != 1) {
              local_54 = 0x203;
              goto LAB_00108696;
            }
          }
          else {
            type = (EVP_MD *)(*local_40->scheme_md)();
            iVar1 = EVP_DigestVerifyInit
                              (local_48,(EVP_PKEY_CTX **)&stack0xffffffffffffffb0,type,(ENGINE *)0x0
                               ,in_RDI);
            if (iVar1 != 1) {
              local_54 = 0x203;
              goto LAB_00108696;
            }
            iVar1 = EVP_PKEY_get_id(in_RDI);
            if (iVar1 == 6) {
              iVar1 = EVP_PKEY_CTX_set_rsa_padding(pEVar3,6);
              if (iVar1 != 1) {
                local_54 = 0x203;
                goto LAB_00108696;
              }
              iVar1 = EVP_PKEY_CTX_set_rsa_pss_saltlen(pEVar3,0xffffffff);
              if (iVar1 != 1) {
                local_54 = 0x203;
                goto LAB_00108696;
              }
              pEVar2 = (*local_40->scheme_md)();
              iVar1 = EVP_PKEY_CTX_set_rsa_mgf1_md(pEVar3,pEVar2);
              if (iVar1 != 1) {
                local_54 = 0x203;
                goto LAB_00108696;
              }
            }
            iVar1 = EVP_DigestVerifyUpdate(local_48,in_RDX,in_RCX);
            if (iVar1 != 1) {
              local_54 = 0x203;
              goto LAB_00108696;
            }
            iVar1 = EVP_DigestVerifyFinal(local_48,in_R8,in_R9);
            if (iVar1 != 1) {
              local_54 = 0x33;
              goto LAB_00108696;
            }
          }
          local_54 = 0;
          goto LAB_00108696;
        }
      }
      local_54 = 0x2f;
    }
  }
LAB_00108696:
  if (local_48 != (EVP_MD_CTX *)0x0) {
    EVP_MD_CTX_free(local_48);
  }
  EVP_PKEY_free(in_RDI);
  return local_54;
}

Assistant:

static int verify_sign(void *verify_ctx, uint16_t algo, ptls_iovec_t data, ptls_iovec_t signature)
{
    EVP_PKEY *key = verify_ctx;
    const struct st_ptls_openssl_signature_scheme_t *scheme;
    EVP_MD_CTX *ctx = NULL;
    EVP_PKEY_CTX *pkey_ctx = NULL;
    int ret = 0;

    if (data.base == NULL)
        goto Exit;

    if ((scheme = lookup_signature_schemes(key)) == NULL) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    for (; scheme->scheme_id != UINT16_MAX; ++scheme)
        if (scheme->scheme_id == algo)
            goto SchemeFound;
    ret = PTLS_ALERT_ILLEGAL_PARAMETER;
    goto Exit;

SchemeFound:
    if ((ctx = EVP_MD_CTX_create()) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }

#if PTLS_OPENSSL_HAVE_ED25519
    if (EVP_PKEY_id(key) == EVP_PKEY_ED25519) {
        /* ED25519 requires the use of the all-at-once function that appeared in OpenSSL 1.1.1, hence different path */
        if (EVP_DigestVerifyInit(ctx, &pkey_ctx, NULL, NULL, key) != 1) {
            ret = PTLS_ERROR_LIBRARY;
            goto Exit;
        }
        if (EVP_DigestVerify(ctx, signature.base, signature.len, data.base, data.len) != 1) {
            ret = PTLS_ERROR_LIBRARY;
            goto Exit;
        }
    } else
#endif
    {
        if (EVP_DigestVerifyInit(ctx, &pkey_ctx, scheme->scheme_md(), NULL, key) != 1) {
            ret = PTLS_ERROR_LIBRARY;
            goto Exit;
        }

        if (EVP_PKEY_id(key) == EVP_PKEY_RSA) {
            if (EVP_PKEY_CTX_set_rsa_padding(pkey_ctx, RSA_PKCS1_PSS_PADDING) != 1) {
                ret = PTLS_ERROR_LIBRARY;
                goto Exit;
            }
            if (EVP_PKEY_CTX_set_rsa_pss_saltlen(pkey_ctx, -1) != 1) {
                ret = PTLS_ERROR_LIBRARY;
                goto Exit;
            }
            if (EVP_PKEY_CTX_set_rsa_mgf1_md(pkey_ctx, scheme->scheme_md()) != 1) {
                ret = PTLS_ERROR_LIBRARY;
                goto Exit;
            }
        }
        if (EVP_DigestVerifyUpdate(ctx, data.base, data.len) != 1) {
            ret = PTLS_ERROR_LIBRARY;
            goto Exit;
        }
        if (EVP_DigestVerifyFinal(ctx, signature.base, signature.len) != 1) {
            ret = PTLS_ALERT_DECRYPT_ERROR;
            goto Exit;
        }
    }

    ret = 0;

Exit:
    if (ctx != NULL)
        EVP_MD_CTX_destroy(ctx);
    EVP_PKEY_free(key);
    return ret;
}